

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smd.c
# Opt level: O2

void * lws_smd_msg_alloc(lws_context *ctx,lws_smd_class_t _class,size_t len)

{
  undefined8 in_RAX;
  undefined4 uVar3;
  undefined8 *puVar1;
  lws_usec_t lVar2;
  lws_log_cx *cx;
  undefined8 *puVar4;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  if (((ctx->smd)._class_filter & _class) == 0) {
    cx = lwsl_context_get_cx(ctx);
    puVar4 = (undefined8 *)0x0;
    _lws_log_cx(cx,lws_log_prepend_context,ctx,8,"lws_smd_msg_alloc",
                "rejecting class 0x%x as no participant wants",CONCAT44(uVar3,_class));
  }
  else {
    if (0x180 < len) {
      __assert_fail("len <= LWS_SMD_MAX_PAYLOAD",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/system/smd/smd.c"
                    ,0x33,"void *lws_smd_msg_alloc(struct lws_context *, lws_smd_class_t, size_t)");
    }
    puVar4 = (undefined8 *)0x0;
    puVar1 = (undefined8 *)lws_realloc((void *)0x0,len + 0x30,"lws_smd_msg_alloc");
    if (puVar1 != (undefined8 *)0x0) {
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar2 = lws_now_usecs();
      puVar1[4] = lVar2;
      *(short *)((long)puVar1 + 0x2c) = (short)len;
      *(lws_smd_class_t *)(puVar1 + 5) = _class;
      puVar4 = puVar1 + 6;
    }
  }
  return puVar4;
}

Assistant:

void *
lws_smd_msg_alloc(struct lws_context *ctx, lws_smd_class_t _class, size_t len)
{
	lws_smd_msg_t *msg;

	/* only allow it if someone wants to consume this class of event */

	if (!(ctx->smd._class_filter & _class)) {
		lwsl_cx_info(ctx, "rejecting class 0x%x as no participant wants",
				(unsigned int)_class);
		return NULL;
	}

	assert(len <= LWS_SMD_MAX_PAYLOAD);


	/*
	 * If SS configured, over-allocate LWS_SMD_SS_RX_HEADER_LEN behind
	 * payload, ie,  msg_t (gap LWS_SMD_SS_RX_HEADER_LEN) payload
	 */
	msg = lws_malloc(sizeof(*msg) + LWS_SMD_SS_RX_HEADER_LEN_EFF + len,
			 __func__);
	if (!msg)
		return NULL;

	memset(msg, 0, sizeof(*msg));
	msg->timestamp = lws_now_usecs();
	msg->length = (uint16_t)len;
	msg->_class = _class;

	return ((uint8_t *)&msg[1]) + LWS_SMD_SS_RX_HEADER_LEN_EFF;
}